

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O1

void __thiscall FNodeBuilder::Clear(FNodeBuilder *this)

{
  FVertexMapSimple *this_00;
  
  this->SegsStuffed = 0;
  if ((this->Nodes).Count != 0) {
    (this->Nodes).Count = 0;
  }
  if ((this->Subsectors).Count != 0) {
    (this->Subsectors).Count = 0;
  }
  if ((this->SubsectorSets).Count != 0) {
    (this->SubsectorSets).Count = 0;
  }
  if ((this->Segs).Count != 0) {
    (this->Segs).Count = 0;
  }
  if ((this->Vertices).Count != 0) {
    (this->Vertices).Count = 0;
  }
  if ((this->SegList).Count != 0) {
    (this->SegList).Count = 0;
  }
  if ((this->PlaneChecked).Count != 0) {
    (this->PlaneChecked).Count = 0;
  }
  if ((this->Planes).Count != 0) {
    (this->Planes).Count = 0;
  }
  if ((this->Touched).Count != 0) {
    (this->Touched).Count = 0;
  }
  if ((this->Colinear).Count != 0) {
    (this->Colinear).Count = 0;
  }
  if ((this->SplitSharers).Count != 0) {
    (this->SplitSharers).Count = 0;
  }
  if (this->VertexMap == (IVertexMap *)0x0) {
    this_00 = (FVertexMapSimple *)operator_new(0x10);
    FVertexMapSimple::FVertexMapSimple(this_00,this);
    this->VertexMap = (IVertexMap *)this_00;
  }
  return;
}

Assistant:

void FNodeBuilder::Clear()
{
	SegsStuffed = 0;
	Nodes.Clear();
	Subsectors.Clear();
	SubsectorSets.Clear();
	Segs.Clear();
	Vertices.Clear();
	SegList.Clear();
	PlaneChecked.Clear();
	Planes.Clear();
	Touched.Clear();
	Colinear.Clear();
	SplitSharers.Clear();
	if (VertexMap == NULL)
	{
		VertexMap = new FVertexMapSimple(*this);
	}
}